

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrFoveationApplyInfoHTC *value)

{
  pointer *this;
  bool bVar1;
  XrResult XVar2;
  allocator local_539;
  string local_538 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_518;
  allocator local_4f9;
  string local_4f8 [32];
  uint local_4d8;
  allocator local_4d1;
  uint32_t value_subimages_inc;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_4b0;
  allocator local_491;
  string local_490 [39];
  allocator local_469;
  string local_468 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_448;
  allocator local_429;
  string local_428 [32];
  string local_408 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3e8;
  allocator local_3c9;
  string local_3c8 [32];
  string local_3a8 [32];
  ostringstream local_388 [8];
  ostringstream oss_enum;
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_198;
  allocator local_179;
  string local_178 [32];
  undefined1 local_158 [40];
  string local_130 [8];
  string error_message;
  allocator local_109;
  string local_108 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e8;
  allocator local_c9;
  string local_c8 [36];
  NextChainResult local_a4;
  value_type local_a0;
  NextChainResult next_result;
  value_type local_8c;
  undefined1 local_88 [8];
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  XrResult xr_result;
  XrFoveationApplyInfoHTC *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  if (value->type != XR_TYPE_FOVEATION_APPLY_INFO_HTC) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrFoveationApplyInfoHTC",value->type,
               "VUID-XrFoveationApplyInfoHTC-type-type",XR_TYPE_FOVEATION_APPLY_INFO_HTC,
               "XR_TYPE_FOVEATION_APPLY_INFO_HTC");
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    this = &duplicate_ext_structs.
            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    local_8c = XR_TYPE_FOVEATION_CUSTOM_MODE_INFO_HTC;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this,&local_8c);
    local_a0 = XR_TYPE_FOVEATION_DYNAMIC_MODE_INFO_HTC;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_a0);
    local_a4 = ValidateNextChain(instance_info,command_name,objects_info,value->next,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 &duplicate_ext_structs.
                                  super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 local_88,(vector<XrStructureType,_std::allocator<XrStructureType>_>
                                           *)&encountered_structs.
                                              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_a4 == NEXT_CHAIN_RESULT_ERROR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"VUID-XrFoveationApplyInfoHTC-next-next",&local_c9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_e8,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_108,
                 "Invalid structure(s) in \"next\" chain for XrFoveationApplyInfoHTC struct \"next\""
                 ,&local_109);
      CoreValidLogMessage(instance_info,(string *)local_c8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_e8,(string *)local_108);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_e8);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_a4 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_130,"Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)(local_158 + 0x27));
      std::allocator<char>::~allocator((allocator<char> *)(local_158 + 0x27));
      std::__cxx11::string::operator+=(local_130,"XrFoveationApplyInfoHTC : ");
      StructTypesToString_abi_cxx11_
                ((GenValidUsageXrInstanceInfo *)local_158,
                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)instance_info);
      std::__cxx11::string::operator+=(local_130,(string *)local_158);
      std::__cxx11::string::~string((string *)local_158);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,"VUID-XrFoveationApplyInfoHTC-next-unique",&local_179);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_198,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1b8,
                 "Multiple structures of the same type(s) in \"next\" chain for XrFoveationApplyInfoHTC struct"
                 ,&local_1b9);
      CoreValidLogMessage(instance_info,(string *)local_178,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_198,(string *)local_1b8);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_198);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_130);
    }
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  if ((check_members) &&
     (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e0,"XrFoveationApplyInfoHTC",&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_208,"mode",&local_209);
    bVar1 = ValidateXrEnum(instance_info,command_name,(string *)local_1e0,(string *)local_208,
                           objects_info,value->mode);
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if ((value->subImageCount == 0) && (value->subImages != (XrSwapchainSubImage *)0x0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_428,"VUID-XrFoveationApplyInfoHTC-subImageCount-arraylength",&local_429);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_448,objects_info);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_468,
                   "Structure XrFoveationApplyInfoHTC member subImageCount is non-optional and must be greater than 0"
                   ,&local_469);
        CoreValidLogMessage(instance_info,(string *)local_428,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_448,(string *)local_468);
        std::__cxx11::string::~string(local_468);
        std::allocator<char>::~allocator((allocator<char> *)&local_469);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_448);
        std::__cxx11::string::~string(local_428);
        std::allocator<char>::~allocator((allocator<char> *)&local_429);
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      }
      if ((value->subImages == (XrSwapchainSubImage *)0x0) && (value->subImageCount != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_490,"VUID-XrFoveationApplyInfoHTC-subImages-parameter",&local_491);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_4b0,objects_info);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&value_subimages_inc,
                   "XrFoveationApplyInfoHTC contains invalid NULL for XrSwapchainSubImage \"subImages\" is which not optional since \"subImageCount\" is set and must be non-NULL"
                   ,&local_4d1);
        CoreValidLogMessage(instance_info,(string *)local_490,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_4b0,(string *)&value_subimages_inc);
        std::__cxx11::string::~string((string *)&value_subimages_inc);
        std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_4b0);
        std::__cxx11::string::~string(local_490);
        std::allocator<char>::~allocator((allocator<char> *)&local_491);
        instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      }
      else {
        if (value->subImages != (XrSwapchainSubImage *)0x0) {
          for (local_4d8 = 0; local_4d8 < value->subImageCount; local_4d8 = local_4d8 + 1) {
            XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                     value->subImages + local_4d8);
            if (XVar2 != XR_SUCCESS) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_4f8,"VUID-XrFoveationApplyInfoHTC-subImages-parameter",&local_4f9);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_518,objects_info);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_538,"Structure XrFoveationApplyInfoHTC member subImages is invalid",
                         &local_539);
              CoreValidLogMessage(instance_info,(string *)local_4f8,VALID_USAGE_DEBUG_SEVERITY_ERROR
                                  ,command_name,&local_518,(string *)local_538);
              std::__cxx11::string::~string(local_538);
              std::allocator<char>::~allocator((allocator<char> *)&local_539);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              ~vector(&local_518);
              std::__cxx11::string::~string(local_4f8);
              std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
              return XVar2;
            }
            valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
          }
        }
        instance_info_local._4_4_ =
             valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_388);
      std::operator<<((ostream *)local_388,
                      "XrFoveationApplyInfoHTC contains invalid XrFoveationModeHTC \"mode\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_((uint32_t)local_3a8);
      std::operator<<((ostream *)local_388,local_3a8);
      std::__cxx11::string::~string(local_3a8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3c8,"VUID-XrFoveationApplyInfoHTC-mode-parameter",&local_3c9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_3e8,objects_info);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(instance_info,(string *)local_3c8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_3e8,local_408);
      std::__cxx11::string::~string((string *)local_408);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_3e8);
      std::__cxx11::string::~string(local_3c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::ostringstream::~ostringstream(local_388);
    }
  }
  else {
    instance_info_local._4_4_ =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrFoveationApplyInfoHTC* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_FOVEATION_APPLY_INFO_HTC) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrFoveationApplyInfoHTC",
                             value->type, "VUID-XrFoveationApplyInfoHTC-type-type", XR_TYPE_FOVEATION_APPLY_INFO_HTC, "XR_TYPE_FOVEATION_APPLY_INFO_HTC");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        valid_ext_structs.push_back(XR_TYPE_FOVEATION_CUSTOM_MODE_INFO_HTC);
        valid_ext_structs.push_back(XR_TYPE_FOVEATION_DYNAMIC_MODE_INFO_HTC);
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrFoveationApplyInfoHTC-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrFoveationApplyInfoHTC struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrFoveationApplyInfoHTC : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrFoveationApplyInfoHTC-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrFoveationApplyInfoHTC struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrFoveationModeHTC value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrFoveationApplyInfoHTC", "mode", objects_info, value->mode)) {
        std::ostringstream oss_enum;
        oss_enum << "XrFoveationApplyInfoHTC contains invalid XrFoveationModeHTC \"mode\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->mode));
        CoreValidLogMessage(instance_info, "VUID-XrFoveationApplyInfoHTC-mode-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->subImageCount && nullptr != value->subImages) {
        CoreValidLogMessage(instance_info, "VUID-XrFoveationApplyInfoHTC-subImageCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrFoveationApplyInfoHTC member subImageCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->subImages && 0 != value->subImageCount) {
        CoreValidLogMessage(instance_info, "VUID-XrFoveationApplyInfoHTC-subImages-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrFoveationApplyInfoHTC contains invalid NULL for XrSwapchainSubImage \"subImages\" is which not "
                            "optional since \"subImageCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->subImages) {
        for (uint32_t value_subimages_inc = 0; value_subimages_inc < value->subImageCount; ++value_subimages_inc) {
            // Validate that the structure XrSwapchainSubImage is valid
            xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                             check_members, true, &value->subImages[value_subimages_inc]);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(instance_info, "VUID-XrFoveationApplyInfoHTC-subImages-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    "Structure XrFoveationApplyInfoHTC member subImages is invalid");
                return xr_result;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}